

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  undefined8 *puVar1;
  double a;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real eps;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  fpclass_type fVar13;
  int32_t iVar14;
  bool bVar15;
  double *pdVar16;
  long lVar17;
  Item *pIVar18;
  bool bVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar18 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  pdVar16 = (double *)__tls_get_addr(&PTR_003b4b70);
  a = *pdVar16;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,a);
  if (0 < (pIVar18->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    iVar2 = pDVar4->data[i];
    lVar20 = 0x38;
    lVar17 = 0;
    do {
      pNVar5 = (pIVar18->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar1 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar20);
      local_d8 = *puVar1;
      uStack_d0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar20 + -0x28);
      local_c8 = *puVar1;
      uStack_c0 = puVar1[1];
      local_b8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar20 + -0x18);
      local_b0 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar20 + -0x10);
      local_ac = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar20 + -0xc);
      local_a8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar20 + -8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_68,(soplex *)&local_d8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)-(pDVar3->data
                                   [*(int *)((long)&(pNVar5->val).m_backend.data + lVar20)] + iVar2)
                 ,CONCAT31((int3)((uint)local_b0 >> 8),local_ac));
      iVar14 = local_68.m_backend.prec_elem;
      fVar13 = local_68.m_backend.fpclass;
      iVar12 = local_68.m_backend.exp;
      uVar11 = local_68.m_backend.data._M_elems[9];
      uVar10 = local_68.m_backend.data._M_elems._28_8_;
      uVar9 = local_68.m_backend.data._M_elems._20_8_;
      uVar8 = local_68.m_backend.data._M_elems._12_8_;
      uVar7 = local_68.m_backend.data._M_elems._4_8_;
      uVar6 = local_68.m_backend.data._M_elems[0];
      bVar19 = local_68.m_backend.neg;
      if (local_68.m_backend.neg == true) {
        bVar19 = local_68.m_backend.fpclass == cpp_dec_float_finite &&
                 local_68.m_backend.data._M_elems[0] == 0;
      }
      local_a0.m_backend.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
      local_a0.m_backend.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
      local_a0.m_backend.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
      local_a0.m_backend.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
      local_a0.m_backend.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
      local_a0.m_backend.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
      local_a0.m_backend.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
      local_a0.m_backend.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
      local_a0.m_backend.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
      local_a0.m_backend.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
      local_a0.m_backend.exp = local_68.m_backend.exp;
      local_a0.m_backend.fpclass = local_68.m_backend.fpclass;
      local_a0.m_backend.prec_elem = local_68.m_backend.prec_elem;
      local_118.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
      local_118.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
      local_118.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
      local_118.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
      local_118.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
      local_118.m_backend.exp = (__return_storage_ptr__->m_backend).exp;
      local_118.m_backend.neg = (__return_storage_ptr__->m_backend).neg;
      local_118.m_backend.fpclass = (__return_storage_ptr__->m_backend).fpclass;
      local_118.m_backend.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_a0.m_backend.neg = bVar19;
      eps = Tolerances::epsilon(this_00);
      bVar15 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_a0,&local_118,eps);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (bVar15) {
        (__return_storage_ptr__->m_backend).data._M_elems[0] = uVar6;
        (__return_storage_ptr__->m_backend).data._M_elems[9] = uVar11;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 5) = uVar9;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 7) = uVar10;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 1) = uVar7;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 3) = uVar8;
        (__return_storage_ptr__->m_backend).exp = iVar12;
        (__return_storage_ptr__->m_backend).neg = bVar19;
        (__return_storage_ptr__->m_backend).fpclass = fVar13;
        (__return_storage_ptr__->m_backend).prec_elem = iVar14;
      }
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x3c;
    } while (lVar17 < (pIVar18->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}